

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::processDecimalWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  byte bVar1;
  pointer pcVar2;
  ushort value;
  uint uVar3;
  ostream *poVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  char cVar8;
  char *pcVar9;
  ulong value_00;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  char cVar18;
  ulong uVar19;
  double value_01;
  
  uVar3 = (uint)word->_M_string_length;
  uVar19 = 0;
  uVar12 = 0;
  if (0 < (int)uVar3) {
    uVar12 = (ulong)uVar3;
  }
  pcVar2 = (word->_M_dataplus)._M_p;
  uVar15 = 0xffffffff;
  uVar11 = 0xffffffff;
  uVar17 = 0xffffffff;
  uVar6 = 0xffffffff;
  iVar13 = -1;
  while( true ) {
    iVar14 = (int)uVar15;
    iVar5 = (int)uVar6;
    iVar10 = (int)uVar11;
    iVar16 = (int)uVar17;
    if (uVar12 == uVar19) break;
    bVar1 = pcVar2[uVar19];
    switch(bVar1) {
    case 0x27:
      if (iVar5 != -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar9 = "extra quote in decimal number";
        goto LAB_00123ca4;
      }
      uVar6 = uVar19 & 0xffffffff;
      break;
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2f:
switchD_001234c4_caseD_28:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
      poVar4 = std::operator<<(poVar4," at token: ");
      poVar4 = std::operator<<(poVar4,(string *)word);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "Invalid character in decimal number (character number ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar19);
      pcVar9 = ")";
      goto LAB_00123ca7;
    case 0x2d:
      if (iVar16 != -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar9 = "cannot have more than two minus signs in number";
        goto LAB_00123ca4;
      }
      if ((uVar19 == 0) || (pcVar2[uVar19 - 1] != '\'')) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar9 = "minus sign must immediately follow quote mark";
        goto LAB_00123ca4;
      }
      uVar17 = uVar19 & 0xffffffff;
      break;
    case 0x2e:
      if (iVar5 == -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar9 = "cannot have decimal marker before quote";
        goto LAB_00123ca4;
      }
      if (iVar10 != -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar9 = "extra period in decimal number";
        goto LAB_00123ca4;
      }
      uVar11 = uVar19 & 0xffffffff;
      break;
    case 0x30:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x39:
      if (iVar5 == -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar9 = "cannot have numbers before quote in decimal number";
        goto LAB_00123ca4;
      }
      break;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x38:
      if ((iVar5 == -1) && (iVar13 != -1)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cerr,"invalid byte specificaton before quote in ")
        ;
        pcVar9 = "decimal number";
        goto LAB_00123ca7;
      }
      if (iVar5 == -1) {
        iVar13 = bVar1 - 0x30;
        uVar6 = 0xffffffff;
      }
      break;
    default:
      if ((bVar1 != 0x55) && (bVar1 != 0x75)) goto switchD_001234c4_caseD_28;
      if (iVar5 != -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar9 = "cannot have endian specified after quote";
        goto LAB_00123ca4;
      }
      if (iVar14 != -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar9 = "extra \"u\" in decimal number";
        goto LAB_00123ca4;
      }
      uVar15 = uVar19 & 0xffffffff;
      uVar6 = 0xffffffff;
    }
    uVar19 = uVar19 + 1;
  }
  if (iVar5 == -1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
    poVar4 = std::operator<<(poVar4," at token: ");
    poVar4 = std::operator<<(poVar4,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar9 = "there must be a quote to signify a decimal number";
LAB_00123ca4:
    poVar4 = (ostream *)&std::cerr;
LAB_00123ca7:
    poVar4 = std::operator<<(poVar4,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar4);
    return 0;
  }
  if (iVar5 == uVar3 - 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
    poVar4 = std::operator<<(poVar4," at token: ");
    poVar4 = std::operator<<(poVar4,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar9 = "there must be a decimal number after the quote";
    goto LAB_00123ca4;
  }
  if ((iVar10 == -1) && (iVar13 == 8)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
    poVar4 = std::operator<<(poVar4," at token: ");
    poVar4 = std::operator<<(poVar4,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar9 = "only floating-point numbers can use 8 bytes";
    goto LAB_00123ca4;
  }
  if (iVar10 != -1) {
    iVar10 = 4;
    if (iVar13 != -1) {
      iVar10 = iVar13;
    }
    value_01 = atof(pcVar2 + (long)iVar5 + 1);
    if (iVar10 == 8) {
      if (iVar14 != -1) {
        writeLittleEndianDouble(out,value_01);
        return 1;
      }
      writeBigEndianDouble(out,value_01);
      return 1;
    }
    if (iVar10 == 4) {
      if (iVar14 != -1) {
        writeLittleEndianFloat(out,(float)value_01);
        return 1;
      }
      writeBigEndianFloat(out,(float)value_01);
      return 1;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
    poVar4 = std::operator<<(poVar4," at token: ");
    poVar4 = std::operator<<(poVar4,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar9 = "floating-point numbers can be only 4 or 8 bytes";
    goto LAB_00123ca4;
  }
  switch(iVar13) {
  default:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
    poVar4 = std::operator<<(poVar4," at token: ");
    poVar4 = std::operator<<(poVar4,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar9 = "invalid byte count specification for decimal number";
    goto LAB_00123ca4;
  case 1:
    uVar3 = atoi(pcVar2 + (long)iVar5 + 1);
    break;
  case 2:
    iVar13 = atoi(pcVar2 + (long)iVar5 + 1);
    value = (ushort)iVar13;
    if (iVar16 == -1) {
      if (iVar14 != -1) {
        writeLittleEndianUShort(out,value);
        return 1;
      }
      writeBigEndianUShort(out,value);
      return 1;
    }
    if (iVar14 != -1) {
      writeLittleEndianShort(out,value);
      return 1;
    }
    writeBigEndianShort(out,value);
    return 1;
  case 3:
    if (iVar16 != -1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
      poVar4 = std::operator<<(poVar4," at token: ");
      poVar4 = std::operator<<(poVar4,(string *)word);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar9 = "negative decimal numbers cannot be stored in 3 bytes";
      goto LAB_00123ca4;
    }
    iVar13 = atoi(pcVar2 + (long)iVar5 + 1);
    cVar7 = (char)iVar13;
    cVar18 = (char)((uint)iVar13 >> 8);
    cVar8 = (char)((uint)iVar13 >> 0x10);
    if (iVar14 == -1) {
      std::operator<<(out,cVar8);
      std::operator<<(out,cVar18);
    }
    else {
      std::operator<<(out,cVar7);
      std::operator<<(out,cVar18);
      cVar7 = cVar8;
    }
    goto LAB_00123b9c;
  case 4:
    iVar13 = atoi(pcVar2 + (long)iVar5 + 1);
    value_00 = (ulong)iVar13;
    if (iVar16 == -1) {
      if (iVar14 != -1) {
        writeLittleEndianULong(out,value_00);
        return 1;
      }
      writeBigEndianULong(out,value_00);
      return 1;
    }
    if (iVar14 != -1) {
      writeLittleEndianLong(out,value_00);
      return 1;
    }
    writeBigEndianLong(out,value_00);
    return 1;
  case -1:
    uVar3 = atoi(pcVar2 + (long)iVar5 + 1);
    if (iVar16 == -1) {
      if (0xff < uVar3) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
        poVar4 = std::operator<<(poVar4," at token: ");
        poVar4 = std::operator<<(poVar4,(string *)word);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar9 = "Decimal number out of range from 0 to 255";
        goto LAB_00123ca4;
      }
    }
    else if ((int)(char)uVar3 != uVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error on line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNum);
      poVar4 = std::operator<<(poVar4," at token: ");
      poVar4 = std::operator<<(poVar4,(string *)word);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar9 = "Decimal number out of range from -128 to 127";
      goto LAB_00123ca4;
    }
  }
  cVar7 = (char)uVar3;
LAB_00123b9c:
  std::operator<<(out,cVar7);
  return 1;
}

Assistant:

int Binasc::processDecimalWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();        // length of ascii binary number
	int byteCount = -1;              // number of bytes to output
	int quoteIndex = -1;             // index of decimal specifier
	int signIndex = -1;              // index of any sign for number
	int periodIndex = -1;            // index of period for floating point
	int endianIndex = -1;            // index of little endian specifier
	int i = 0;

	// make sure that all characters are valid
	for (i=0; i<length; i++) {
		switch (word[i]) {
			case '\'':
				if (quoteIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra quote in decimal number" << std::endl;
					return 0;
				} else {
					quoteIndex = i;
				}
				break;
			case '-':
				if (signIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have more than two minus signs in number"
						  << std::endl;
					return 0;
				} else {
					signIndex = i;
				}
				if (i == 0 || word[i-1] != '\'') {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "minus sign must immediately follow quote mark" << std::endl;
					return 0;
				}
				break;
			case '.':
				if (quoteIndex == -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have decimal marker before quote" << std::endl;
					return 0;
				}
				if (periodIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra period in decimal number" << std::endl;
					return 0;
				} else {
					periodIndex = i;
				}
				break;
			case 'u':
			case 'U':
				if (quoteIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have endian specified after quote" << std::endl;
					return 0;
				}
				if (endianIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra \"u\" in decimal number" << std::endl;
					return 0;
				} else {
					endianIndex = i;
				}
				break;
			case '8':
			case '1': case '2': case '3': case '4':
				if (quoteIndex == -1 && byteCount != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "invalid byte specificaton before quote in "
						  << "decimal number" << std::endl;
					return 0;
				} else if (quoteIndex == -1) {
					byteCount = word[i] - '0';
				}
				break;
			case '0': case '5': case '6': case '7': case '9':
				if (quoteIndex == -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have numbers before quote in decimal number"
						  << std::endl;
					return 0;
				}
				break;
			default:
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Invalid character in decimal number"
						  " (character number " << i <<")" << std::endl;
				return 0;
		}
	}

	// there must be a quote character to indicate a decimal number
	// and there must be a decimal number after the quote
	if (quoteIndex == -1) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "there must be a quote to signify a decimal number" << std::endl;
		return 0;
	} else if (quoteIndex == length - 1) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "there must be a decimal number after the quote" << std::endl;
		return 0;
	}

	// 8 byte decimal output can only occur if reading a double number
	if (periodIndex == -1 && byteCount == 8) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "only floating-point numbers can use 8 bytes" << std::endl;
		return 0;
	}

	// default size for floating point numbers is 4 bytes
	if (periodIndex != -1) {
		if (byteCount == -1) {
			byteCount = 4;
		}
	}

	// process any floating point numbers possibilities
	if (periodIndex != -1) {
		double doubleOutput = atof(&word[quoteIndex+1]);
		float  floatOutput  = (float)doubleOutput;
		switch (byteCount) {
			case 4:
			  if (endianIndex == -1) {
				  writeBigEndianFloat(out, floatOutput);
			  } else {
				  writeLittleEndianFloat(out, floatOutput);
			  }
			  return 1;
			  break;
			case 8:
			  if (endianIndex == -1) {
				  writeBigEndianDouble(out, doubleOutput);
			  } else {
				  writeLittleEndianDouble(out, doubleOutput);
			  }
			  return 1;
			  break;
			default:
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "floating-point numbers can be only 4 or 8 bytes" << std::endl;
				return 0;
		}
	}

	// process any integer decimal number possibilities

	// default integer size is one byte, if size is not specified, then
	// the number must be in the one byte range and cannot overflow
	// the byte if the size of the decimal number is not specified
	if (byteCount == -1) {
		if (signIndex != -1) {
			long tempLong = atoi(&word[quoteIndex + 1]);
			if (tempLong > 127 || tempLong < -128) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Decimal number out of range from -128 to 127" << std::endl;
				return 0;
			}
			char charOutput = (char)tempLong;
			out << charOutput;
			return 1;
		} else {
			ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
			uchar ucharOutput = (uchar)tempLong;
			if (tempLong > 255) { // || (tempLong < 0)) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Decimal number out of range from 0 to 255" << std::endl;
				return 0;
			}
			out << ucharOutput;
			return 1;
		}
	}

	// left with an integer number with a specified number of bytes
	switch (byteCount) {
		case 1:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				char charOutput = (char)tempLong;
				out << charOutput;
				return 1;
			} else {
				ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
				uchar ucharOutput = (uchar)tempLong;
				out << ucharOutput;
				return 1;
			}
			break;
		case 2:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				short shortOutput = (short)tempLong;
				if (endianIndex == -1) {
					writeBigEndianShort(out, shortOutput);
				} else {
					writeLittleEndianShort(out, shortOutput);
				}
				return 1;
			} else {
				ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
				ushort ushortOutput = (ushort)tempLong;
				if (endianIndex == -1) {
					writeBigEndianUShort(out, ushortOutput);
				} else {
					writeLittleEndianUShort(out, ushortOutput);
				}
				return 1;
			}
			break;
		case 3:
			{
			if (signIndex != -1) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "negative decimal numbers cannot be stored in 3 bytes"
					  << std::endl;
				return 0;
			}
			ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
			uchar byte1 = (uchar)((tempLong & 0x00ff0000) >> 16);
			uchar byte2 = (uchar)((tempLong & 0x0000ff00) >> 8);
			uchar byte3 = (uchar)((tempLong & 0x000000ff));
			if (endianIndex == -1) {
				out << byte1;
				out << byte2;
				out << byte3;
			} else {
				out << byte3;
				out << byte2;
				out << byte1;
			}
			return 1;
			}
			break;
		case 4:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				if (endianIndex == -1) {
					writeBigEndianLong(out, tempLong);
				} else {
					writeLittleEndianLong(out, tempLong);
				}
				return 1;
			} else {
				ulong tempuLong = (ulong)atoi(&word[quoteIndex + 1]);
				if (endianIndex == -1) {
					writeBigEndianULong(out, tempuLong);
				} else {
					writeLittleEndianULong(out, tempuLong);
				}
				return 1;
			}
			break;
		default:
			std::cerr << "Error on line " << lineNum << " at token: " << word
				  << std::endl;
			std::cerr << "invalid byte count specification for decimal number" << std::endl;
			return 0;
	}
}